

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

void __thiscall LlvmCompilationContext::~LlvmCompilationContext(LlvmCompilationContext *this)

{
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::~SmallArray(&this->loopInfo);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray(&this->currentRestoreBlocks);
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
  ~SmallDenseMap(&this->variables);
  SmallArray<LLVMValueRefOpaque_*,_128U>::~SmallArray(&this->functions);
  SmallArray<LLVMTypeRefOpaque_*,_128U>::~SmallArray(&this->types);
  return;
}

Assistant:

LlvmCompilationContext(ExpressionContext &ctx): ctx(ctx), types(ctx.allocator), functions(ctx.allocator), currentRestoreBlocks(ctx.allocator), loopInfo(ctx.allocator), allocator(ctx.allocator)
	{
		enableOptimization = false;

		context = NULL;

		module = NULL;

		builder = NULL;

		functionPassManager = NULL;

		skipFunctionDefinitions = false;

		currentFunction = NULL;
		currentFunctionSource = NULL;
		currentFunctionGlobal = false;

		currentNextRestoreBlock = 0;
	}